

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregion.cpp
# Opt level: O3

bool EqualRegion(QRegionPrivate *r1,QRegionPrivate *r2)

{
  QRect *pQVar1;
  QRect *pQVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = r1->numRects;
  if (iVar3 == r2->numRects) {
    if (iVar3 == 0) {
      return true;
    }
    if (((((r1->extents).x1.m_i == (r2->extents).x1.m_i) &&
         ((r1->extents).x2.m_i == (r2->extents).x2.m_i)) &&
        ((r1->extents).y1.m_i == (r2->extents).y1.m_i)) &&
       ((r1->extents).y2.m_i == (r2->extents).y2.m_i)) {
      if (iVar3 < 2) {
        return true;
      }
      pQVar1 = (r2->rects).d.ptr;
      pQVar2 = (r1->rects).d.ptr;
      lVar4 = 0;
      while (((*(int *)((long)&(pQVar2->x1).m_i + lVar4) ==
               *(int *)((long)&(pQVar1->x1).m_i + lVar4) &&
              (*(int *)((long)&(pQVar2->x2).m_i + lVar4) ==
               *(int *)((long)&(pQVar1->x2).m_i + lVar4))) &&
             ((*(int *)((long)&(pQVar2->y1).m_i + lVar4) ==
               *(int *)((long)&(pQVar1->y1).m_i + lVar4) &&
              (*(int *)((long)&(pQVar2->y2).m_i + lVar4) ==
               *(int *)((long)&(pQVar1->y2).m_i + lVar4)))))) {
        lVar4 = lVar4 + 0x10;
        iVar3 = iVar3 + -1;
        if (iVar3 == 0) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool EqualRegion(const QRegionPrivate *r1, const QRegionPrivate *r2)
{
    if (r1->numRects != r2->numRects) {
        return false;
    } else if (r1->numRects == 0) {
        return true;
    } else if (r1->extents != r2->extents) {
        return false;
    } else if (r1->numRects == 1 && r2->numRects == 1) {
        return true; // equality tested in previous if-statement
    } else {
        const QRect *rr1 = (r1->numRects == 1) ? &r1->extents : r1->rects.constData();
        const QRect *rr2 = (r2->numRects == 1) ? &r2->extents : r2->rects.constData();
        for (int i = 0; i < r1->numRects; ++i, ++rr1, ++rr2) {
            if (*rr1 != *rr2)
                return false;
        }
    }

    return true;
}